

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O2

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleMeshNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *pScene)

{
  aiMesh **__args;
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  aiMesh *this_00;
  Property *prop;
  Logger *this_01;
  DDLNode *this_02;
  string *__k;
  mapped_type_conflict3 *pmVar4;
  string propKey;
  string propName;
  string local_200;
  string local_1e0;
  char *local_1c0 [4];
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_1a0 [376];
  
  this_00 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this_00);
  __args = &this->m_currentMesh;
  this->m_currentMesh = this_00;
  puVar1 = (this->m_meshCache).
           super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (this->m_meshCache).
           super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::
  vector<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>,std::allocator<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>>>
  ::emplace_back<aiMesh*&>
            ((vector<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>,std::allocator<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>>>
              *)&this->m_meshCache,__args);
  prop = ODDLParser::DDLNode::getProperties(node);
  if (prop != (Property *)0x0) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    local_1e0._M_string_length = 0;
    local_1e0.field_2._M_local_buf[0] = '\0';
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    local_200._M_string_length = 0;
    local_200.field_2._M_local_buf[0] = '\0';
    propId2StdString(prop,&local_1e0,&local_200);
    bVar3 = std::operator==("primitive",&local_1e0);
    if (bVar3) {
      bVar3 = std::operator==("points",&local_200);
      if (bVar3) {
        (*__args)->mPrimitiveTypes = (*__args)->mPrimitiveTypes | 1;
      }
      else {
        bVar3 = std::operator==("lines",&local_200);
        if (bVar3) {
          (*__args)->mPrimitiveTypes = (*__args)->mPrimitiveTypes | 2;
        }
        else {
          bVar3 = std::operator==("triangles",&local_200);
          if (bVar3) {
            (*__args)->mPrimitiveTypes = (*__args)->mPrimitiveTypes | 4;
          }
          else {
            bVar3 = std::operator==("quads",&local_200);
            if (bVar3) {
              (*__args)->mPrimitiveTypes = (*__args)->mPrimitiveTypes | 8;
            }
            else {
              this_01 = DefaultLogger::get();
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              basic_formatter<std::__cxx11::string>(local_1a0,&local_200);
              std::operator<<((ostream *)local_1a0," is not supported primitive type.");
              std::__cxx11::stringbuf::str();
              Logger::warn(this_01,local_1c0[0]);
              std::__cxx11::string::~string((string *)local_1c0);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_1e0);
  }
  handleNodes(this,node,pScene);
  this_02 = ODDLParser::DDLNode::getParent(node);
  if (this_02 != (DDLNode *)0x0) {
    __k = ODDLParser::DDLNode::getName_abi_cxx11_(this_02);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[](&this->m_mesh2refMap,__k);
    *pmVar4 = (long)puVar1 - (long)puVar2 >> 3;
  }
  return;
}

Assistant:

void OpenGEXImporter::handleMeshNode( ODDLParser::DDLNode *node, aiScene *pScene ) {
    m_currentMesh = new aiMesh;
    const size_t meshidx( m_meshCache.size() );
    // ownership is transferred but a reference remains in m_currentMesh
    m_meshCache.emplace_back( m_currentMesh );

    Property *prop = node->getProperties();
    if( nullptr != prop ) {
        std::string propName, propKey;
        propId2StdString( prop, propName, propKey );
        if( "primitive" == propName ) {
            if ( "points" == propKey ) {
                m_currentMesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
            } else if ( "lines" == propKey ) {
                m_currentMesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
            } else if( "triangles" == propKey ) {
                m_currentMesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
            } else if ( "quads" == propKey ) {
                m_currentMesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
            } else {
                ASSIMP_LOG_WARN_F( propKey, " is not supported primitive type." );
            }
        }
    }

    handleNodes( node, pScene );

    DDLNode *parent( node->getParent() );
    if( nullptr != parent ) {
        const std::string &name = parent->getName();
        m_mesh2refMap[ name ] = meshidx;
    }
}